

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

void Js::JavascriptBigInt::AddAbsolute(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  unsigned_long *puVar1;
  Type TVar2;
  code *pcVar3;
  digit_t *pdVar4;
  bool bVar5;
  undefined4 *puVar6;
  unsigned_long **ppuVar7;
  digit_t dVar8;
  digit_t *local_48;
  digit_t tempCarryDigit_1;
  digit_t tempCarryDigit;
  digit_t i;
  digit_t *pDigit2;
  digit_t *pDigit1;
  digit_t carryDigit;
  JavascriptBigInt *pbi2_local;
  JavascriptBigInt *pbi1_local;
  
  carryDigit = (digit_t)pbi2;
  pbi2_local = pbi1;
  if (pbi1->m_length < pbi2->m_length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x1c4,"(pbi1->m_length >= pbi2->m_length)",
                                "pbi1->m_length >= pbi2->m_length");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pDigit1 = (digit_t *)0x0;
  ppuVar7 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                      ((WriteBarrierPtr *)&pbi2_local->m_digits);
  pDigit2 = *ppuVar7;
  ppuVar7 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                      ((WriteBarrierPtr *)(carryDigit + 0x10));
  i = (digit_t)*ppuVar7;
  for (tempCarryDigit = 0; tempCarryDigit < *(ulong *)(carryDigit + 0x18);
      tempCarryDigit = tempCarryDigit + 1) {
    tempCarryDigit_1 = 0;
    dVar8 = AddDigit(pDigit2[tempCarryDigit],*(digit_t *)(i + tempCarryDigit * 8),&tempCarryDigit_1)
    ;
    pDigit2[tempCarryDigit] = dVar8;
    dVar8 = AddDigit(pDigit2[tempCarryDigit],(digit_t)pDigit1,&tempCarryDigit_1);
    pDigit2[tempCarryDigit] = dVar8;
    pDigit1 = (digit_t *)tempCarryDigit_1;
  }
  for (; tempCarryDigit < pbi2_local->m_length && pDigit1 != (digit_t *)0x0;
      tempCarryDigit = tempCarryDigit + 1) {
    local_48 = (digit_t *)0x0;
    dVar8 = AddDigit(pDigit2[tempCarryDigit],(digit_t)pDigit1,(digit_t *)&local_48);
    pDigit2[tempCarryDigit] = dVar8;
    pDigit1 = local_48;
  }
  if (pDigit1 != (digit_t *)0x0) {
    if (pbi2_local->m_maxLength <= pbi2_local->m_length) {
      Resize(pbi2_local,pbi2_local->m_length + 1);
    }
    pdVar4 = pDigit1;
    ppuVar7 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                        ((WriteBarrierPtr *)&pbi2_local->m_digits);
    puVar1 = *ppuVar7;
    TVar2 = pbi2_local->m_length;
    pbi2_local->m_length = TVar2 + 1;
    puVar1[TVar2] = (unsigned_long)pdVar4;
  }
  return;
}

Assistant:

void JavascriptBigInt::AddAbsolute(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        Assert(pbi1->m_length >= pbi2->m_length);
        digit_t carryDigit = 0;
        digit_t *pDigit1 = pbi1->m_digits;
        digit_t *pDigit2 = pbi2->m_digits;
        digit_t i = 0;

        for (; i < pbi2->m_length; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::AddDigit(pDigit1[i], pDigit2[i], &tempCarryDigit);
            pDigit1[i] = JavascriptBigInt::AddDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }

        for (; i < pbi1->m_length && carryDigit > 0; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::AddDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }

        if (0 < carryDigit) // length increase by 1
        {
            if (pbi1->m_length >= pbi1->m_maxLength)
            {
                pbi1->Resize(pbi1->m_length + 1);
            }
            pbi1->m_digits[pbi1->m_length++] = carryDigit;
        }
    }